

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

void Sbc_Mult(word a,word b,word *r)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = (a & 0xffffffff) * (b >> 0x20);
  uVar1 = (b & 0xffffffff) * (a >> 0x20);
  *r = b * a;
  r[1] = (((b & 0xffffffff) * (a & 0xffffffff) >> 0x20) +
          (uVar1 & 0xffffffff) + (uVar2 & 0xffffffff) >> 0x20) +
         (uVar1 >> 0x20) + (uVar2 >> 0x20) + (a >> 0x20) * (b >> 0x20);
  return;
}

Assistant:

void Sbc_Mult( word a, word b, word r[2] )
{
    word Msk = 0xFFFFFFFF;
    word pL  = (a & Msk) * (b & Msk);
    word pM1 = (a & Msk) * (b >> 32);
    word pM2 = (a >> 32) * (b & Msk);
    word pH  = (a >> 32) * (b >> 32);
    word Car = (pM1 & Msk) + (pM2 & Msk) + (pL >> 32);
    r[0] = a * b;
    r[1] = pH + (pM1 >> 32) + (pM2 >> 32) + (Car >> 32);
}